

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.hpp
# Opt level: O3

bool chain::str::equal<(chain::str::case_t)1>(string_view left,string_view right)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  
  sVar4 = left._M_len;
  if (sVar4 != right._M_len) {
    return false;
  }
  if (sVar4 == 0) {
    bVar6 = true;
  }
  else {
    lVar5 = 0;
    do {
      bVar1 = right._M_str[lVar5];
      iVar2 = tolower((uint)(byte)left._M_str[lVar5]);
      iVar3 = tolower((uint)bVar1);
      bVar6 = iVar2 == iVar3;
      if (!bVar6) {
        return bVar6;
      }
      bVar7 = sVar4 - 1 != lVar5;
      lVar5 = lVar5 + 1;
    } while (bVar7);
  }
  return bVar6;
}

Assistant:

auto equal(std::string_view left, std::string_view right) -> bool
{
    if (left.length() == right.length())
    {
        if constexpr (case_type == case_t::sensitive)
        {
            return left == right;
        }
        else
        {
            return std::equal(left.begin(), left.end(), right.begin(), right.end(), equal_uchar<case_t::insensitive>);
        }
    }

    return false;
}